

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,HeapType type)

{
  HeapType HVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  __hash_code __code;
  undefined1 local_a0 [8];
  TypeNames names;
  HeapType type_local;
  Signature local_48;
  
  names.fieldNames._M_h._M_single_bucket = (__node_base_ptr)type.id;
  if (0x7c < type.id) {
    local_48.results.id = local_48.params.id;
    local_48.params.id = type.id;
    if ((this->generator).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->generator)._M_invoker)
              ((TypeNames *)local_a0,(_Any_data *)&this->generator,(HeapType *)&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(type ",6);
    poVar5 = Name::print((Name *)local_a0,this->os);
    local_48.params.id._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
    if (*(char *)type.id == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(; temp ;) ",0xb);
    }
    HVar1.id = *(uintptr_t *)(type.id + 8);
    if ((HVar1.id == 0) && (*(char *)(type.id + 1) != '\x01')) {
      bVar3 = false;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(sub ",5);
      if (*(char *)(type.id + 1) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(this->os,"final ",6);
      }
      bVar3 = true;
      if (HVar1.id != 0) {
        printHeapTypeName(this,HVar1);
        local_48.params.id._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
      }
    }
    if (*(int *)(type.id + 4) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(shared ",8);
    }
    HVar1.id = *(uintptr_t *)(type.id + 0x18);
    if (HVar1.id != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(describes ",0xb);
      printHeapTypeName(this,HVar1);
      local_48.params.id._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    HVar1.id = *(uintptr_t *)(type.id + 0x10);
    if (HVar1.id != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(descriptor ",0xc);
      printHeapTypeName(this,HVar1);
      local_48.params.id._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    switch(*(undefined4 *)(type.id + 0x30)) {
    case 0:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x743);
    case 1:
      local_48 = HeapType::getSignature((HeapType *)&names.fieldNames._M_h._M_single_bucket);
      print(this,&local_48);
      break;
    case 2:
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(struct",7);
      if (*(long *)(type.id + 0x40) != *(long *)(type.id + 0x38)) {
        uVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(this->os," (field ",8);
          if (*(long **)(names.name.super_IString.str._M_str +
                        (uVar8 % (ulong)names.fieldNames._M_h._M_buckets) * 8) != (long *)0x0) {
            plVar2 = (long *)**(long **)(names.name.super_IString.str._M_str +
                                        (uVar8 % (ulong)names.fieldNames._M_h._M_buckets) * 8);
            uVar4 = *(uint *)(plVar2 + 1);
            while ((uint)uVar8 != uVar4) {
              plVar2 = (long *)*plVar2;
              if ((plVar2 == (long *)0x0) ||
                 (uVar4 = *(uint *)(plVar2 + 1),
                 (ulong)uVar4 % (ulong)names.fieldNames._M_h._M_buckets !=
                 uVar8 % (ulong)names.fieldNames._M_h._M_buckets)) goto LAB_00cafb08;
            }
            poVar5 = Name::print((Name *)(plVar2 + 2),this->os);
            local_48.params.id._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
          }
LAB_00cafb08:
          print(this,(Field *)(uVar8 * 0x10 + *(long *)(type.id + 0x38)));
          local_48.params.id._0_1_ = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
          uVar8 = (ulong)((uint)uVar8 + 1);
        } while (uVar8 < (ulong)(*(long *)(type.id + 0x40) - *(long *)(type.id + 0x38) >> 4));
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os,")",1);
      type.id = (uintptr_t)names.fieldNames._M_h._M_single_bucket;
      if (names.fieldNames._M_h._M_single_bucket < (__node_base_ptr)0x7d) {
        uVar4 = (uint)(((ulong)names.fieldNames._M_h._M_single_bucket & 4) == 0);
        goto LAB_00cafbda;
      }
      break;
    case 3:
      local_48 = *(Signature *)(type.id + 0x38);
      print(this,(Array *)&local_48);
      break;
    case 4:
      local_48.params.id = *(uintptr_t *)(type.id + 0x38);
      print(this,(Continuation *)&local_48);
    }
    if (((__node_base_ptr)(type.id + 0x10))->_M_nxt != (_Hash_node_base *)0x0) {
      local_48.params.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    if (((__node_base_ptr)(type.id + 0x18))->_M_nxt != (_Hash_node_base *)0x0) {
      local_48.params.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    uVar4 = *(uint *)((long)&((__node_base_ptr)type.id)->_M_nxt + 4);
LAB_00cafbda:
    if (uVar4 == 0) {
      local_48.params.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    if (bVar3) {
      local_48.params.id._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    }
    local_48.params.id._0_1_ = 0x29;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(this->os,(char *)&local_48,1);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&names.name.super_IString.str._M_str);
    return poVar5;
  }
  if ((type.id & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(shared ",8);
  }
  uVar4 = (uint)type.id & 0x7b;
  switch(uVar4 << 0x1d | uVar4 - 8 >> 3) {
  case 0:
    poVar5 = this->os;
    pcVar7 = "extern";
    goto LAB_00cafcd6;
  case 1:
    poVar5 = this->os;
    pcVar7 = "func";
    goto LAB_00cafce7;
  case 2:
    poVar5 = this->os;
    pcVar7 = "cont";
    goto LAB_00cafce7;
  case 3:
    poVar5 = this->os;
    pcVar7 = "any";
    goto LAB_00cafcf8;
  case 4:
    poVar5 = this->os;
    pcVar7 = "eq";
    lVar6 = 2;
    break;
  case 5:
    poVar5 = this->os;
    pcVar7 = "i31";
    goto LAB_00cafcf8;
  case 6:
    poVar5 = this->os;
    pcVar7 = "struct";
    goto LAB_00cafcd6;
  case 7:
    poVar5 = this->os;
    pcVar7 = "array";
    goto LAB_00cafca1;
  case 8:
    poVar5 = this->os;
    pcVar7 = "exn";
LAB_00cafcf8:
    lVar6 = 3;
    break;
  case 9:
    poVar5 = this->os;
    pcVar7 = "string";
    goto LAB_00cafcd6;
  case 10:
    poVar5 = this->os;
    pcVar7 = "none";
LAB_00cafce7:
    lVar6 = 4;
    break;
  case 0xb:
    poVar5 = this->os;
    pcVar7 = "noextern";
    lVar6 = 8;
    break;
  case 0xc:
    poVar5 = this->os;
    pcVar7 = "nofunc";
    goto LAB_00cafcd6;
  case 0xd:
    poVar5 = this->os;
    pcVar7 = "nocont";
LAB_00cafcd6:
    lVar6 = 6;
    break;
  case 0xe:
    poVar5 = this->os;
    pcVar7 = "noexn";
LAB_00cafca1:
    lVar6 = 5;
    break;
  default:
    goto switchD_00caf89c_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
switchD_00caf89c_default:
  if ((type.id & 4) != 0) {
    local_a0[0] = ')';
    std::__ostream_insert<char,std::char_traits<char>>(this->os,local_a0,1);
  }
  return this->os;
}

Assistant:

std::ostream& TypePrinter::print(HeapType type) {
  if (type.isBasic()) {
    if (type.isShared()) {
      os << "(shared ";
    }
    switch (type.getBasic(Unshared)) {
      case HeapType::ext:
        os << "extern";
        break;
      case HeapType::func:
        os << "func";
        break;
      case HeapType::cont:
        os << "cont";
        break;
      case HeapType::any:
        os << "any";
        break;
      case HeapType::eq:
        os << "eq";
        break;
      case HeapType::i31:
        os << "i31";
        break;
      case HeapType::struct_:
        os << "struct";
        break;
      case HeapType::array:
        os << "array";
        break;
      case HeapType::exn:
        os << "exn";
        break;
      case HeapType::string:
        os << "string";
        break;
      case HeapType::none:
        os << "none";
        break;
      case HeapType::noext:
        os << "noextern";
        break;
      case HeapType::nofunc:
        os << "nofunc";
        break;
      case HeapType::nocont:
        os << "nocont";
        break;
      case HeapType::noexn:
        os << "noexn";
        break;
    }
    if (type.isShared()) {
      os << ')';
    }
    return os;
  }

  auto names = generator(type);

  os << "(type ";
  names.name.print(os) << ' ';

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }

  bool useSub = false;
  auto super = type.getDeclaredSuperType();
  if (super || type.isOpen()) {
    useSub = true;
    os << "(sub ";
    if (!type.isOpen()) {
      os << "final ";
    }
    if (super) {
      printHeapTypeName(*super);
      os << ' ';
    }
  }
  if (type.isShared()) {
    os << "(shared ";
  }
  if (auto desc = type.getDescribedType()) {
    os << "(describes ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  if (auto desc = type.getDescriptorType()) {
    os << "(descriptor ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  switch (type.getKind()) {
    case HeapTypeKind::Func:
      print(type.getSignature());
      break;
    case HeapTypeKind::Struct:
      print(type.getStruct(), names.fieldNames);
      break;
    case HeapTypeKind::Array:
      print(type.getArray());
      break;
    case HeapTypeKind::Cont:
      print(type.getContinuation());
      break;
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  if (type.getDescriptorType()) {
    os << ')';
  }
  if (type.getDescribedType()) {
    os << ')';
  }
  if (type.isShared()) {
    os << ')';
  }
  if (useSub) {
    os << ')';
  }
  return os << ')';
}